

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typebase.cpp
# Opt level: O0

string * __thiscall
ICM::TypeBase::DisperseType::to_string_abi_cxx11_(string *__return_storage_ptr__,DisperseType *this)

{
  const_iterator cVar1;
  const_iterator cVar2;
  DisperseType *this_local;
  
  cVar1 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::begin(&this->data);
  cVar2 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::end(&this->data);
  Common::Convert::
  to_string<(char)0,(char)0,(char)0,__gnu_cxx::__normal_iterator<ICM::Object*const*,std::vector<ICM::Object*,std::allocator<ICM::Object*>>>,ICM::TypeBase::DisperseType::to_string[abi:cxx11]()const::__0>
            (__return_storage_ptr__,(Convert *)cVar1._M_current,cVar2._M_current);
  return __return_storage_ptr__;
}

Assistant:

string DisperseType::to_string() const {
			return Convert::to_string(data.begin(), data.end(), [](const ObjectPtr &op) { return ICM::to_string(op); });
		}